

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O1

bool __thiscall ON_Localizer::Read(ON_Localizer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_NurbsCurve *this_00;
  ON_NurbsSurface *this_01;
  byte bVar4;
  bool bReadCurve;
  bool bReadSurface;
  int mjv;
  int mnv;
  int i;
  int major_version;
  int minor_version;
  bool local_36;
  bool local_35;
  int local_34 [2];
  ON__INT32 local_2c;
  int local_28 [2];
  
  Destroy(this);
  bVar2 = false;
  local_28[0] = 0;
  local_28[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_28,local_28 + 1);
  if (bVar1) {
    bVar1 = local_28[0] == 1;
    if (bVar1) {
      local_2c = no_type;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&local_2c);
      if (bVar1) {
        if (local_2c - sphere_type < 6) {
          this->m_type = local_2c;
        }
        bVar1 = ON_BinaryArchive::ReadPoint(archive,&this->m_P);
        if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadVector(archive,&this->m_V), bVar1)) &&
           (bVar1 = ON_BinaryArchive::ReadInterval(archive,&this->m_d), bVar1)) {
          local_34[0] = 0;
          local_34[1] = 0;
          bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_34,local_34 + 1);
          if (bVar1) {
            bVar4 = local_34[0] == 1;
            local_36 = false;
            if ((bool)bVar4) {
              bVar4 = ON_BinaryArchive::ReadBool(archive,&local_36);
            }
            if (((bool)bVar4 != false) && (local_36 == true)) {
              this_00 = (ON_NurbsCurve *)operator_new(0x40);
              ON_NurbsCurve::ON_NurbsCurve(this_00);
              this->m_nurbs_curve = this_00;
              iVar3 = (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0xb])(this_00,archive);
              bVar4 = (byte)iVar3;
            }
            bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
            bVar1 = (bool)(bVar1 & bVar4);
            if ((bVar1 == true) &&
               (bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                                  (archive,0x40008000,local_34,local_34 + 1), bVar1)) {
              local_35 = false;
              bVar4 = ON_BinaryArchive::ReadBool(archive,&local_35);
              if (((bool)bVar4) && (local_35 == true)) {
                this_01 = (ON_NurbsSurface *)operator_new(0x58);
                ON_NurbsSurface::ON_NurbsSurface(this_01);
                this->m_nurbs_surface = this_01;
                iVar3 = (*(this_01->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                          _vptr_ON_Object[0xb])(this_01,archive);
                bVar4 = (byte)iVar3;
              }
              bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
              bVar1 = (bool)(bVar1 & bVar4);
            }
          }
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_Localizer::Read(ON_BinaryArchive& archive)
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if ( !rc ) break;

    int i = no_type;
    rc = archive.ReadInt(&i);
    if ( !rc ) break;

    switch(i)
    {
    case sphere_type:   m_type = sphere_type;   break;
    case plane_type:    m_type = plane_type;    break;
    case cylinder_type: m_type = cylinder_type; break;
    case curve_type:    m_type = curve_type;    break;
    case surface_type:  m_type = surface_type;  break;
    case distance_type: m_type = distance_type; break;
    }

    rc = archive.ReadPoint(m_P);
    if ( !rc ) break;
    rc = archive.ReadVector(m_V);
    if ( !rc ) break;
    rc = archive.ReadInterval(m_d);
    if ( !rc ) break;

    int mjv = 0, mnv = 0;
    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
    if (!rc) break;
    rc = (1 == mjv);
    bool bReadCurve = false;
    if (rc)
      rc = archive.ReadBool( &bReadCurve );
    if ( rc && bReadCurve)
    {
      m_nurbs_curve = new ON_NurbsCurve();
      rc = m_nurbs_curve->Read(archive)?true:false;
    }
    if ( !archive.EndRead3dmChunk() )
      rc = false;
    if (!rc) break;

    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
    if (!rc) break;
    rc = (1 == mjv);
    bool bReadSurface = false;
    rc = archive.ReadBool( &bReadSurface );
    if ( rc && bReadSurface )
    {
      m_nurbs_surface = new ON_NurbsSurface();
      rc = m_nurbs_surface->Read(archive)?true:false;
    }
    if ( !archive.EndRead3dmChunk() )
      rc = false;
    if (!rc) break;

    break;
  }
  
  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}